

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator::treeFind
          (const_iterator *this,unsigned_long left,unsigned_long right)

{
  size_type sVar1;
  pointer pEVar2;
  NodeRef node;
  uint32_t uVar3;
  NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_> *pNVar4;
  uint uVar5;
  int iVar6;
  uint32_t uVar7;
  ulong uVar8;
  interval<unsigned_long> ival;
  interval<unsigned_long> local_40;
  
  local_40.left = left;
  local_40.right = right;
  uVar3 = IntervalMapDetails::
          NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_true>_>::
          find((NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_true>_>
                *)this->map,this->map->rootSize,&local_40);
  uVar7 = 0;
  if (uVar3 != 0) {
    uVar7 = uVar3 - 1;
  }
  setRoot(this,uVar7);
  sVar1 = (this->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  if ((sVar1 != 0) &&
     (pEVar2 = (this->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
     , pEVar2->offset < pEVar2->size)) {
    iVar6 = (int)sVar1;
    uVar5 = iVar6 - 1;
    pNVar4 = (NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_>
              *)((ulong)pEVar2[uVar5].offset * 8 + (long)pEVar2[uVar5].node);
    iVar6 = iVar6 - this->map->height;
    while( true ) {
      node.pip.value = *(PointerIntPair<void_*,_6U,_6U,_unsigned_int> *)pNVar4;
      pNVar4 = (NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_>
                *)((ulong)node.pip.value & 0xffffffffffffffc0);
      uVar7 = ((uint)node.pip.value & 0x3f) + 1;
      if (iVar6 == 0) break;
      uVar7 = IntervalMapDetails::
              NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_>
              ::find(pNVar4,uVar7,&local_40);
      uVar8 = (ulong)(uVar7 - 1);
      if (uVar7 == 0) {
        uVar8 = 0;
      }
      IntervalMapDetails::Path::push(&this->path,node,(uint32_t)uVar8);
      pNVar4 = pNVar4 + uVar8 * 8;
      iVar6 = iVar6 + 1;
    }
    uVar7 = IntervalMapDetails::
            NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_false>_>
            ::find((NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_false>_>
                    *)pNVar4,uVar7,&local_40);
    IntervalMapDetails::Path::push(&this->path,node,uVar7);
  }
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::const_iterator::treeFind(TKey left, TKey right) {
    using namespace IntervalMapDetails;
    SLANG_ASSERT(!isFlat());

    interval<TKey> ival{left, right};
    uint32_t offset = map->rootBranch.find(map->rootSize, ival);
    if (offset)
        offset--;
    setRoot(offset);

    if (valid()) {
        auto child = path.childAt(path.height());
        for (uint32_t i = map->height - path.height() - 1; i > 0; i--) {
            offset = child.template get<Branch>().find(child.size(), ival);
            if (offset)
                offset--;
            path.push(child, offset);
            child = child.childAt(offset);
        }

        path.push(child, child.template get<Leaf>().find(child.size(), ival));
    }
}